

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# execmd.c
# Opt level: O0

void vocdusave_delwrd(voccxdef *ctx,objnum objn,prpnum typ,int flags,char *wrd)

{
  int iVar1;
  uchar *puVar2;
  uchar in_CL;
  uchar in_DL;
  ushort in_SI;
  long in_RDI;
  void *in_R8;
  objucxdef *uc;
  uchar *p;
  ushort wrdsiz;
  ushort in_stack_ffffffffffffffcc;
  uchar in_stack_ffffffffffffffcf;
  objucxdef *undoctx;
  
  undoctx = *(objucxdef **)(in_RDI + 0x20);
  iVar1 = osrp2(in_R8);
  puVar2 = objures(undoctx,in_stack_ffffffffffffffcf,in_stack_ffffffffffffffcc);
  *puVar2 = '\x05';
  puVar2[1] = in_CL;
  puVar2[2] = in_DL;
  oswp2(puVar2 + 3,(uint)in_SI);
  memcpy(puVar2 + 5,in_R8,(ulong)(ushort)iVar1);
  undoctx->objucxhead = undoctx->objucxhead + (ushort)iVar1 + 5;
  return;
}

Assistant:

void vocdusave_delwrd(voccxdef *ctx, objnum objn, prpnum typ, int flags,
                      char *wrd)
{
    ushort     wrdsiz;
    uchar     *p;
    objucxdef *uc = ctx->voccxundo;

    /* figure out how much space we need, and reserve it */
    wrdsiz = osrp2(wrd);
    p = objures(uc, OBJUCLI, (ushort)(5 + wrdsiz));

    *p = VOC_UNDO_DELVOC;
    *(p+1) = flags;
    *(p+2) = (uchar)typ;
    oswp2(p+3, objn);
    memcpy(p+5, wrd, (size_t)wrdsiz);

    uc->objucxhead += 5 + wrdsiz;
}